

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sl_serial.c
# Opt level: O2

slReturn setTermOptionsBaud(int fdPort,int baud)

{
  errInfo error;
  speed_t __speed;
  int iVar1;
  slReturn pvVar2;
  int *piVar3;
  char *pcVar4;
  char *pcVar5;
  termios options;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  uint32_t uVar12;
  undefined4 uVar13;
  termios local_14c;
  errorInfo_slReturn local_110;
  errorInfo_slReturn local_f0;
  errorInfo_slReturn local_d0;
  errorInfo_slReturn local_b0;
  errorInfo_slReturn local_90;
  errorInfo_slReturn local_70;
  errorInfo_slReturn local_50;
  errorInfo_slReturn local_30;
  
  if (fdPort < 0) {
    createErrorInfo(&local_30,
                    "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/sl_serial.c"
                    ,"setTermOptionsBaud",0xba,(slReturn)0x0);
    uVar10 = SUB84(local_30.functionName,0);
    uVar11 = (undefined4)((ulong)local_30.functionName >> 0x20);
    uVar12 = local_30.lineNumber;
    uVar13 = local_30._28_4_;
    uVar6 = SUB84(local_30.cause,0);
    uVar7 = (undefined4)((ulong)local_30.cause >> 0x20);
    uVar8 = SUB84(local_30.fileName,0);
    uVar9 = (undefined4)((ulong)local_30.fileName >> 0x20);
    pcVar4 = "Invalid serial port file descriptor";
  }
  else {
    __speed = getBaudRateCookie(baud);
    if (-1 < (int)__speed) {
      iVar1 = tcdrain(fdPort);
      if (iVar1 < 0) {
        createErrorInfo(&local_70,
                        "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/sl_serial.c"
                        ,"setTermOptionsBaud",0xc1,(slReturn)0x0);
        piVar3 = __errno_location();
        pcVar4 = strerror(*piVar3);
        pcVar5 = "error from tcdrain(): %s";
      }
      else {
        iVar1 = tcgetattr(fdPort,&local_14c);
        if (iVar1 < 0) {
          createErrorInfo(&local_90,
                          "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/sl_serial.c"
                          ,"setTermOptionsBaud",0xc3,(slReturn)0x0);
          piVar3 = __errno_location();
          pcVar4 = strerror(*piVar3);
          pcVar5 = "error from tcgetattr(): %s";
        }
        else {
          iVar1 = cfsetispeed(&local_14c,__speed);
          if (iVar1 < 0) {
            createErrorInfo(&local_b0,
                            "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/sl_serial.c"
                            ,"setTermOptionsBaud",0xc5,(slReturn)0x0);
            piVar3 = __errno_location();
            pcVar4 = strerror(*piVar3);
            pcVar5 = "error from cfsetispeed(): %s";
          }
          else {
            iVar1 = cfsetospeed(&local_14c,__speed);
            if (iVar1 < 0) {
              createErrorInfo(&local_d0,
                              "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/sl_serial.c"
                              ,"setTermOptionsBaud",199,(slReturn)0x0);
              piVar3 = __errno_location();
              pcVar4 = strerror(*piVar3);
              pcVar5 = "error from cfsetospeed(): %s";
            }
            else {
              iVar1 = tcflush(fdPort,0);
              if (iVar1 < 0) {
                createErrorInfo(&local_f0,
                                "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/sl_serial.c"
                                ,"setTermOptionsBaud",0xc9,(slReturn)0x0);
                piVar3 = __errno_location();
                pcVar4 = strerror(*piVar3);
                pcVar5 = "error from tcflush(): %s";
              }
              else {
                iVar1 = tcsetattr(fdPort,0,&local_14c);
                if (-1 < iVar1) {
                  pvVar2 = makeOkReturn();
                  return pvVar2;
                }
                createErrorInfo(&local_110,
                                "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/sl_serial.c"
                                ,"setTermOptionsBaud",0xcb,(slReturn)0x0);
                piVar3 = __errno_location();
                pcVar4 = strerror(*piVar3);
                pcVar5 = "error from tcsetattr(): %s";
              }
            }
          }
        }
      }
      pvVar2 = makeErrorFmtMsgReturn(pcVar5,pcVar4);
      return pvVar2;
    }
    createErrorInfo(&local_50,
                    "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/sl_serial.c"
                    ,"setTermOptionsBaud",0xbc,(slReturn)0x0);
    uVar10 = SUB84(local_50.functionName,0);
    uVar11 = (undefined4)((ulong)local_50.functionName >> 0x20);
    uVar12 = local_50.lineNumber;
    uVar13 = local_50._28_4_;
    uVar6 = SUB84(local_50.cause,0);
    uVar7 = (undefined4)((ulong)local_50.cause >> 0x20);
    uVar8 = SUB84(local_50.fileName,0);
    uVar9 = (undefined4)((ulong)local_50.fileName >> 0x20);
    pcVar4 = "Invalid baud rate";
  }
  error.cause._4_4_ = uVar7;
  error.cause._0_4_ = uVar6;
  error.fileName._0_4_ = uVar8;
  error.fileName._4_4_ = uVar9;
  error.functionName._0_4_ = uVar10;
  error.functionName._4_4_ = uVar11;
  error.lineNumber = uVar12;
  error._28_4_ = uVar13;
  pvVar2 = makeErrorMsgReturn(error,pcVar4);
  return pvVar2;
}

Assistant:

extern slReturn setTermOptionsBaud( int fdPort, int baud ) {

    if( fdPort < 0 ) return makeErrorMsgReturn( ERR_ROOT, "Invalid serial port file descriptor" );
    int baudCookie = getBaudRateCookie( baud );
    if( baudCookie < 0 ) return makeErrorMsgReturn( ERR_ROOT, "Invalid baud rate" );

    struct termios options;
    int result;
    result = tcdrain( fdPort );
    if( result < 0 ) return makeErrorFmtMsgReturn( ERR_ROOT, "error from tcdrain(): %s", strerror(errno) );
    result = tcgetattr( fdPort, &options );
    if( result < 0 ) return makeErrorFmtMsgReturn( ERR_ROOT, "error from tcgetattr(): %s", strerror(errno) );
    result = cfsetispeed( &options, (speed_t) baudCookie );
    if( result < 0 ) return makeErrorFmtMsgReturn( ERR_ROOT, "error from cfsetispeed(): %s", strerror(errno) );
    result = cfsetospeed( &options, (speed_t) baudCookie );
    if( result < 0 ) return makeErrorFmtMsgReturn( ERR_ROOT, "error from cfsetospeed(): %s", strerror(errno) );
    result = tcflush( fdPort, TCIFLUSH );
    if( result < 0 ) return makeErrorFmtMsgReturn( ERR_ROOT, "error from tcflush(): %s", strerror(errno) );
    result = tcsetattr( fdPort, TCSANOW, &options );
    if( result < 0 ) return makeErrorFmtMsgReturn( ERR_ROOT, "error from tcsetattr(): %s", strerror(errno) );
    return makeOkReturn();
}